

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.hpp
# Opt level: O0

void __thiscall libtorrent::bitfield::bitfield(bitfield *this,int bits,bool val)

{
  bool val_local;
  int bits_local;
  bitfield *this_local;
  
  libtorrent::aux::unique_ptr<unsigned_int[],_long>::unique_ptr(&this->m_buf);
  resize(this,bits,val);
  return;
}

Assistant:

bitfield(int bits, bool val) { resize(bits, val); }